

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Base64.c
# Opt level: O3

WJTL_STATUS TestBase64Encode(void)

{
  JL_STATUS JVar1;
  int iVar2;
  JL_STATUS JVar3;
  int iVar4;
  JL_STATUS JVar5;
  int iVar6;
  JL_STATUS JVar7;
  int iVar8;
  JL_STATUS JVar9;
  int iVar10;
  char *pcVar11;
  WJTL_STATUS WVar12;
  long lVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  uint8_t data [3];
  uint8_t data3 [256];
  uint8_t data2 [768];
  char *local_468;
  undefined2 local_45c;
  undefined1 local_45a;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char local_438 [1032];
  
  local_45a = 3;
  local_45c = 0x201;
  lVar13 = 0;
  local_468 = (char *)0x0;
  JVar1 = JlBase64Encode(&local_45c,1,&local_468);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data, 1, &string ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2a);
  local_440 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2b);
  iVar2 = strcmp(local_468,"AQ");
  WjTestLib_Assert(iVar2 == 0,"strcmp( string, \"AQ\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2c);
  WjTestLib_Free(local_468);
  local_468 = (char *)0x0;
  JVar3 = JlBase64Encode(&local_45c,2,&local_468);
  WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data, 2, &string ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x2f);
  local_448 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x30);
  iVar4 = strcmp(local_468,"AQI");
  WjTestLib_Assert(iVar4 == 0,"strcmp( string, \"AQI\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x31);
  WjTestLib_Free(local_468);
  local_468 = (char *)0x0;
  JVar5 = JlBase64Encode(&local_45c,3,&local_468);
  WjTestLib_Assert(JVar5 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data, 3, &string ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x34);
  local_450 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x35);
  iVar6 = strcmp(local_468,"AQID");
  WjTestLib_Assert(iVar6 == 0,"strcmp( string, \"AQID\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x36);
  WjTestLib_Free(local_468);
  local_468 = (char *)0x0;
  pcVar11 = local_438 + 0x102;
  do {
    cVar14 = (char)lVar13;
    pcVar11[-2] = cVar14;
    pcVar11[-1] = cVar14;
    *pcVar11 = cVar14;
    lVar13 = lVar13 + 1;
    pcVar11 = pcVar11 + 3;
  } while (lVar13 != 0x100);
  JVar7 = JlBase64Encode(local_438 + 0x100,0x300,&local_468);
  WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data2, sizeof(data2), &string ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x52);
  local_458 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x53);
  iVar8 = strcmp(local_468,
                 "AAAAAQEBAgICAwMDBAQEBQUFBgYGBwcHCAgICQkJCgoKCwsLDAwMDQ0NDg4ODw8PEBAQEREREhISExMTFBQUFRUVFhYWFxcXGBgYGRkZGhoaGxsbHBwcHR0dHh4eHx8fICAgISEhIiIiIyMjJCQkJSUlJiYmJycnKCgoKSkpKioqKysrLCwsLS0tLi4uLy8vMDAwMTExMjIyMzMzNDQ0NTU1NjY2Nzc3ODg4OTk5Ojo6Ozs7PDw8PT09Pj4+Pz8/QEBAQUFBQkJCQ0NDRERERUVFRkZGR0dHSEhISUlJSkpKS0tLTExMTU1NTk5OT09PUFBQUVFRUlJSU1NTVFRUVVVVVlZWV1dXWFhYWVlZWlpaW1tbXFxcXV1dXl5eX19fYGBgYWFhYmJiY2NjZGRkZWVlZmZmZ2dnaGhoaWlpampqa2trbGxsbW1tbm5ub29vcHBwcXFxcnJyc3NzdHR0dXV1dnZ2d3d3eHh4eXl5enp6e3t7fHx8fX19fn5+f39/gICAgYGBgoKCg4ODhISEhYWFhoaGh4eHiIiIiYmJioqKi4uLjIyMjY2Njo6Oj4+PkJCQkZGRkpKSk5OTlJSUlZWVlpaWl5eXmJiYmZmZmpqam5ubnJycnZ2dnp6en5+foKCgoaGhoqKio6OjpKSkpaWlpqamp6enqKioqampqqqqq6urrKysra2trq6ur6+vsLCwsbGxsrKys7OztLS0tbW1tra2t7e3uLi4ubm5urq6u7u7vLy8vb29vr6+v7+/wMDAwcHBwsLCw8PDxMTExcXFxsbGx8fHyMjIycnJysrKy8vLzMzMzc3Nzs7Oz8/P0NDQ0dHR0tLS09PT1NTU1dXV1tbW19fX2NjY2dnZ2tra29vb3Nzc3d3d3t7e39/f4ODg4eHh4uLi4+Pj5OTk5eXl5ubm5+fn6Ojo6enp6urq6+vr7Ozs7e3t7u7u7+/v8PDw8fHx8vLy8/Pz9PT09fX19vb29/f3+Pj4+fn5+vr6+/v7/Pz8/f39/v7+////"
                );
  WjTestLib_Assert(iVar8 == 0,"strcmp( string, data2Result) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x54);
  WjTestLib_Free(local_468);
  local_468 = (char *)0x0;
  cVar14 = '\0';
  cVar15 = '\x01';
  cVar16 = '\x02';
  cVar17 = '\x03';
  cVar18 = '\x04';
  cVar19 = '\x05';
  cVar20 = '\x06';
  cVar21 = '\a';
  cVar22 = '\b';
  cVar23 = '\t';
  cVar24 = '\n';
  cVar25 = '\v';
  cVar26 = '\f';
  cVar27 = '\r';
  cVar28 = '\x0e';
  cVar29 = '\x0f';
  lVar13 = 0;
  do {
    local_438[lVar13] = cVar14;
    local_438[lVar13 + 1] = cVar15;
    local_438[lVar13 + 2] = cVar16;
    local_438[lVar13 + 3] = cVar17;
    local_438[lVar13 + 4] = cVar18;
    local_438[lVar13 + 5] = cVar19;
    local_438[lVar13 + 6] = cVar20;
    local_438[lVar13 + 7] = cVar21;
    local_438[lVar13 + 8] = cVar22;
    local_438[lVar13 + 9] = cVar23;
    local_438[lVar13 + 10] = cVar24;
    local_438[lVar13 + 0xb] = cVar25;
    local_438[lVar13 + 0xc] = cVar26;
    local_438[lVar13 + 0xd] = cVar27;
    local_438[lVar13 + 0xe] = cVar28;
    local_438[lVar13 + 0xf] = cVar29;
    lVar13 = lVar13 + 0x10;
    cVar14 = cVar14 + '\x10';
    cVar15 = cVar15 + '\x10';
    cVar16 = cVar16 + '\x10';
    cVar17 = cVar17 + '\x10';
    cVar18 = cVar18 + '\x10';
    cVar19 = cVar19 + '\x10';
    cVar20 = cVar20 + '\x10';
    cVar21 = cVar21 + '\x10';
    cVar22 = cVar22 + '\x10';
    cVar23 = cVar23 + '\x10';
    cVar24 = cVar24 + '\x10';
    cVar25 = cVar25 + '\x10';
    cVar26 = cVar26 + '\x10';
    cVar27 = cVar27 + '\x10';
    cVar28 = cVar28 + '\x10';
    cVar29 = cVar29 + '\x10';
  } while (lVar13 != 0x100);
  JVar9 = JlBase64Encode(local_438,0x100,&local_468);
  WjTestLib_Assert(JVar9 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlBase64Encode( data3, sizeof(data3), &string ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x65);
  pcVar11 = local_468;
  WjTestLib_Assert(local_468 != (char *)0x0,"(string) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x66);
  iVar10 = strcmp(local_468,
                  "AAECAwQFBgcICQoLDA0ODxAREhMUFRYXGBkaGxwdHh8gISIjJCUmJygpKissLS4vMDEyMzQ1Njc4OTo7PD0+P0BBQkNERUZHSElKS0xNTk9QUVJTVFVWV1hZWltcXV5fYGFiY2RlZmdoaWprbG1ub3BxcnN0dXZ3eHl6e3x9fn+AgYKDhIWGh4iJiouMjY6PkJGSk5SVlpeYmZqbnJ2en6ChoqOkpaanqKmqq6ytrq+wsbKztLW2t7i5uru8vb6/wMHCw8TFxsfIycrLzM3Oz9DR0tPU1dbX2Nna29zd3t/g4eLj5OXm5+jp6uvs7e7v8PHy8/T19vf4+fr7/P3+/w"
                 );
  WVar12 = WJTL_STATUS_SUCCESS;
  if (((JVar3 != JL_STATUS_SUCCESS || iVar4 != 0) || (iVar2 != 0 || JVar1 != JL_STATUS_SUCCESS)) ||
      JVar5 != JL_STATUS_SUCCESS) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (local_440 == (char *)0x0) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (local_448 == (char *)0x0) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (local_450 == (char *)0x0) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if ((((JVar7 != JL_STATUS_SUCCESS || iVar6 != 0) || iVar8 != 0) || JVar9 != JL_STATUS_SUCCESS) ||
      iVar10 != 0) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (local_458 == (char *)0x0) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (pcVar11 == (char *)0x0) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(iVar10 == 0,"strcmp( string, data3Result) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Base64.c"
                   ,"TestBase64Encode",0x67);
  WjTestLib_Free(local_468);
  return WVar12;
}

Assistant:

static
WJTL_STATUS
    TestBase64Encode
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    uint8_t data[] = { 1, 2, 3 };
    char* string = NULL;

    JL_ASSERT_SUCCESS( JlBase64Encode( data, 1, &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, "AQ" ) == 0 );
    JlFree( string );  string = NULL;

    JL_ASSERT_SUCCESS( JlBase64Encode( data, 2, &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, "AQI" ) == 0 );
    JlFree( string );  string = NULL;

    JL_ASSERT_SUCCESS( JlBase64Encode( data, 3, &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, "AQID" ) == 0 );
    JlFree( string );  string = NULL;

    uint8_t data2[256*3];
    for( int i=0; i<256; i++ )
    {
        data2[i*3 + 0] = (uint8_t)i;
        data2[i*3 + 1] = (uint8_t)i;
        data2[i*3 + 2] = (uint8_t)i;
    }
    char const* data2Result =
        "AAAAAQEBAgICAwMDBAQEBQUFBgYGBwcHCAgICQkJCgoKCwsLDAwMDQ0NDg4ODw8P"
        "EBAQEREREhISExMTFBQUFRUVFhYWFxcXGBgYGRkZGhoaGxsbHBwcHR0dHh4eHx8f"
        "ICAgISEhIiIiIyMjJCQkJSUlJiYmJycnKCgoKSkpKioqKysrLCwsLS0tLi4uLy8v"
        "MDAwMTExMjIyMzMzNDQ0NTU1NjY2Nzc3ODg4OTk5Ojo6Ozs7PDw8PT09Pj4+Pz8/"
        "QEBAQUFBQkJCQ0NDRERERUVFRkZGR0dHSEhISUlJSkpKS0tLTExMTU1NTk5OT09P"
        "UFBQUVFRUlJSU1NTVFRUVVVVVlZWV1dXWFhYWVlZWlpaW1tbXFxcXV1dXl5eX19f"
        "YGBgYWFhYmJiY2NjZGRkZWVlZmZmZ2dnaGhoaWlpampqa2trbGxsbW1tbm5ub29v"
        "cHBwcXFxcnJyc3NzdHR0dXV1dnZ2d3d3eHh4eXl5enp6e3t7fHx8fX19fn5+f39/"
        "gICAgYGBgoKCg4ODhISEhYWFhoaGh4eHiIiIiYmJioqKi4uLjIyMjY2Njo6Oj4+P"
        "kJCQkZGRkpKSk5OTlJSUlZWVlpaWl5eXmJiYmZmZmpqam5ubnJycnZ2dnp6en5+f"
        "oKCgoaGhoqKio6OjpKSkpaWlpqamp6enqKioqampqqqqq6urrKysra2trq6ur6+v"
        "sLCwsbGxsrKys7OztLS0tbW1tra2t7e3uLi4ubm5urq6u7u7vLy8vb29vr6+v7+/"
        "wMDAwcHBwsLCw8PDxMTExcXFxsbGx8fHyMjIycnJysrKy8vLzMzMzc3Nzs7Oz8/P"
        "0NDQ0dHR0tLS09PT1NTU1dXV1tbW19fX2NjY2dnZ2tra29vb3Nzc3d3d3t7e39/f"
        "4ODg4eHh4uLi4+Pj5OTk5eXl5ubm5+fn6Ojo6enp6urq6+vr7Ozs7e3t7u7u7+/v"
        "8PDw8fHx8vLy8/Pz9PT09fX19vb29/f3+Pj4+fn5+vr6+/v7/Pz8/f39/v7+////";

    JL_ASSERT_SUCCESS( JlBase64Encode( data2, sizeof(data2), &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, data2Result) == 0 );

    JlFree( string ); string = NULL;

    uint8_t data3[256];
    for( int i=0; i<256; i++ )
    {
        data3[i] = (uint8_t)i;
    }
    char const* data3Result =
        "AAECAwQFBgcICQoLDA0ODxAREhMUFRYXGBkaGxwdHh8gISIjJCUmJygpKissLS4v"
        "MDEyMzQ1Njc4OTo7PD0+P0BBQkNERUZHSElKS0xNTk9QUVJTVFVWV1hZWltcXV5f"
        "YGFiY2RlZmdoaWprbG1ub3BxcnN0dXZ3eHl6e3x9fn+AgYKDhIWGh4iJiouMjY6P"
        "kJGSk5SVlpeYmZqbnJ2en6ChoqOkpaanqKmqq6ytrq+wsbKztLW2t7i5uru8vb6/"
        "wMHCw8TFxsfIycrLzM3Oz9DR0tPU1dbX2Nna29zd3t/g4eLj5OXm5+jp6uvs7e7v"
        "8PHy8/T19vf4+fr7/P3+/w";

    JL_ASSERT_SUCCESS( JlBase64Encode( data3, sizeof(data3), &string ) );
    JL_ASSERT_NOT_NULL( string );
    JL_ASSERT( strcmp( string, data3Result) == 0 );

    JlFree( string ); string = NULL;

    return TestReturn;
}